

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg-val-math.c
# Opt level: O2

int rtosc_arg_val_div(rtosc_arg_val_t *lhs,rtosc_arg_val_t *rhs,rtosc_arg_val_t *res)

{
  int iVar1;
  
  iVar1 = 0;
  if (lhs->type == rhs->type) {
    res->type = lhs->type;
    switch(lhs->type) {
    case 'c':
    case 'i':
      (res->val).i = (lhs->val).i / (rhs->val).i;
      break;
    case 'd':
      (res->val).d = (lhs->val).d / (rhs->val).d;
      break;
    case 'e':
    case 'g':
      goto switchD_0010e525_caseD_65;
    case 'f':
      (res->val).f = (lhs->val).f / (rhs->val).f;
      break;
    case 'h':
      (res->val).h = (lhs->val).h / (rhs->val).h;
      break;
    default:
      if (lhs->type != 'T') {
        return 0;
      }
      res->type = 'T';
      (res->val).T = '\x01';
    }
    iVar1 = 1;
  }
switchD_0010e525_caseD_65:
  return iVar1;
}

Assistant:

int rtosc_arg_val_div(const rtosc_arg_val_t* lhs, const rtosc_arg_val_t* rhs,
                      rtosc_arg_val_t* res)
{
    if(lhs->type != rhs->type)
        return false;
    res->type = lhs->type;
    switch(lhs->type)
    {
        case 'd': res->val.d = lhs->val.d / rhs->val.d; return true;
        case 'f': res->val.f = lhs->val.f / rhs->val.f; return true;
        case 'h': res->val.h = lhs->val.h / rhs->val.h; return true;
        case 'c':
        case 'i': res->val.i = lhs->val.i / rhs->val.i; return true;
        case 'T': res->type = 'T'; res->val.T = 1; return true;
        case 'F': assert(false); return false; // divide by 0
        default: return false;
    }
}